

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuVfsFileSize(sqlite3_file *pFile,sqlite_int64 *pSize)

{
  int iVar1;
  
  iVar1 = (**(code **)(*(long *)pFile[1].pMethods + 0x30))();
  if ((((iVar1 == 0) && (*pSize == 0)) && (pFile[3].pMethods != (sqlite3_io_methods *)0x0)) &&
     (((pFile[3].pMethods)->xWrite == (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0
      && (((ulong)pFile[5].pMethods & 0x100) != 0)))) {
    *pSize = 0x400;
  }
  return iVar1;
}

Assistant:

static int rbuVfsFileSize(sqlite3_file *pFile, sqlite_int64 *pSize){
  rbu_file *p = (rbu_file *)pFile;
  int rc;
  rc = p->pReal->pMethods->xFileSize(p->pReal, pSize);

  /* If this is an RBU vacuum operation and this is the target database,
  ** pretend that it has at least one page. Otherwise, SQLite will not
  ** check for the existance of a *-wal file. rbuVfsRead() contains 
  ** similar logic.  */
  if( rc==SQLITE_OK && *pSize==0 
   && p->pRbu && rbuIsVacuum(p->pRbu) 
   && (p->openFlags & SQLITE_OPEN_MAIN_DB)
  ){
    *pSize = 1024;
  }
  return rc;
}